

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

QCborValue * __thiscall
QJsonPrivate::Parser::parseValue(QCborValue *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  StashedContainer local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = this->json;
  pcVar1 = pcVar3 + 1;
  this->json = pcVar1;
  cVar2 = *pcVar3;
  if (cVar2 == '\"') {
    bVar4 = parseString(this);
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    if (bVar4) {
      __return_storage_ptr__->t = String;
      goto LAB_002c5bc7;
    }
LAB_002c5b3f:
    __return_storage_ptr__->t = Undefined;
  }
  else {
    if (cVar2 == ',') {
LAB_002c5b31:
      this->lastError = IllegalValue;
LAB_002c5b39:
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      goto LAB_002c5b3f;
    }
    if (cVar2 == '[') {
      local_30.type = Array;
      local_30._4_4_ = 0xaaaaaaaa;
      local_30.stashed.d.ptr =
           (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->container).d.ptr;
      (this->container).d.ptr = (QCborContainerPrivate *)0x0;
      bVar4 = parseArray(this);
      if (bVar4) {
        StashedContainer::intoValue(__return_storage_ptr__,&local_30,&this->container);
      }
      else {
LAB_002c5bb2:
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        __return_storage_ptr__->t = Undefined;
      }
LAB_002c5bbf:
      QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer
                (&local_30.stashed);
    }
    else {
      if (cVar2 == ']') {
LAB_002c5a06:
        this->lastError = MissingObject;
        goto LAB_002c5b39;
      }
      if (cVar2 == 'f') {
        if (((((long)this->end - (long)pcVar1 < 4) || (this->json = pcVar3 + 2, pcVar3[1] != 'a'))
            || (this->json = pcVar3 + 3, pcVar3[2] != 'l')) ||
           ((this->json = pcVar3 + 4, pcVar3[3] != 's' ||
            (this->json = pcVar3 + 5, pcVar3[4] != 'e')))) goto LAB_002c5b31;
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        __return_storage_ptr__->t = False;
      }
      else {
        if (cVar2 == '}') goto LAB_002c5a06;
        if (cVar2 == 't') {
          if ((((long)this->end - (long)pcVar1 < 3) || (this->json = pcVar3 + 2, pcVar3[1] != 'r'))
             || ((this->json = pcVar3 + 3, pcVar3[2] != 'u' ||
                 (this->json = pcVar3 + 4, pcVar3[3] != 'e')))) goto LAB_002c5b31;
          __return_storage_ptr__->n = 0;
          __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
          __return_storage_ptr__->t = True;
        }
        else {
          if (cVar2 == '{') {
            local_30.type = Map;
            local_30._4_4_ = 0xaaaaaaaa;
            local_30.stashed.d.ptr =
                 (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->container).d.ptr;
            (this->container).d.ptr = (QCborContainerPrivate *)0x0;
            bVar4 = parseObject(this);
            if (!bVar4) goto LAB_002c5bb2;
            StashedContainer::intoValue(__return_storage_ptr__,&local_30,&this->container);
            goto LAB_002c5bbf;
          }
          if (cVar2 != 'n') {
            this->json = pcVar3;
            if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
              parseNumber(__return_storage_ptr__,this);
              return __return_storage_ptr__;
            }
            goto LAB_002c5c11;
          }
          if (((((long)this->end - (long)pcVar1 < 3) || (this->json = pcVar3 + 2, pcVar3[1] != 'u'))
              || (this->json = pcVar3 + 3, pcVar3[2] != 'l')) ||
             (this->json = pcVar3 + 4, pcVar3[3] != 'l')) goto LAB_002c5b31;
          __return_storage_ptr__->n = 0;
          __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
          __return_storage_ptr__->t = Null;
        }
      }
    }
  }
LAB_002c5bc7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_002c5c11:
  __stack_chk_fail();
}

Assistant:

QCborValue Parser::parseValue()
{
    switch (*json++) {
    case 'n':
        if (end - json < 3) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'u' &&
            *json++ == 'l' &&
            *json++ == 'l') {
            return QCborValue(QCborValue::Null);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case 't':
        if (end - json < 3) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'r' &&
            *json++ == 'u' &&
            *json++ == 'e') {
            return QCborValue(true);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case 'f':
        if (end - json < 4) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'a' &&
            *json++ == 'l' &&
            *json++ == 's' &&
            *json++ == 'e') {
            return QCborValue(false);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case Quote: {
        if (parseString())
            // strings are already added to the container
            // callers must check for this type
            return QCborValue(QCborValue::String);

        return QCborValue();
    }
    case BeginArray: {
        StashedContainer stashedContainer(&container, QCborValue::Array);
        if (parseArray())
            return stashedContainer.intoValue(&container);

        return QCborValue();
    }
    case BeginObject: {
        StashedContainer stashedContainer(&container, QCborValue::Map);
        if (parseObject())
            return stashedContainer.intoValue(&container);

        return QCborValue();
    }
    case ValueSeparator:
        // Essentially missing value, but after a colon, not after a comma
        // like the other MissingObject errors.
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case EndObject:
    case EndArray:
        lastError = QJsonParseError::MissingObject;
        return QCborValue();
    default:
        --json;
        return parseNumber();
    }
}